

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

OutPt * __thiscall
ClipperLib::Clipper::AddLocalMinPoly(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *Pt)

{
  double dVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  OutPt *op1;
  TEdge *pTVar5;
  OutPt *op2;
  TEdge *e;
  ulong uVar6;
  IntPoint pt2;
  IntPoint pt1;
  IntPoint pt3;
  
  dVar1 = e2->Dx;
  if (((dVar1 == -1e+40) && (!NAN(dVar1))) || (dVar1 < e1->Dx)) {
    op1 = AddOutPt(this,e1,Pt);
    e2->OutIdx = e1->OutIdx;
    e1->Side = esLeft;
    e2->Side = esRight;
    e = e1->PrevInAEL;
    pTVar5 = e2;
    if (e != e2) goto LAB_0029233a;
  }
  else {
    op1 = AddOutPt(this,e2,Pt);
    e1->OutIdx = e2->OutIdx;
    e1->Side = esRight;
    e2->Side = esLeft;
    e = e2->PrevInAEL;
    bVar4 = e != e1;
    pTVar5 = e1;
    e1 = e2;
    if (bVar4) goto LAB_0029233a;
  }
  e = pTVar5->PrevInAEL;
LAB_0029233a:
  if ((e != (TEdge *)0x0) && (-1 < e->OutIdx)) {
    lVar2 = (e->Top).Y;
    lVar3 = Pt->Y;
    if ((((lVar2 < lVar3) &&
         (((e1->Top).Y < lVar3 &&
          (dVar1 = (double)(lVar3 - (e->Bot).Y) * e->Dx, uVar6 = -(ulong)(dVar1 < 0.0),
          pt1.X = (long)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar1)
                  + (e->Bot).X, dVar1 = (double)(lVar3 - (e1->Bot).Y) * e1->Dx,
          uVar6 = -(ulong)(dVar1 < 0.0),
          pt1.X == (long)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar1
                         ) + (e1->Bot).X)))) && (e1->WindDelta != 0)) &&
       ((e->WindDelta != 0 &&
        (pt2.Y = lVar2, pt2.X = (e->Top).X, pt1.Y = lVar3, pt3.Y = lVar3, pt3.X = pt1.X,
        bVar4 = SlopesEqual(pt1,pt2,pt3,e1->Top,
                            (bool)(this->_vptr_Clipper[-3] + 8)
                                  [(long)&(this->m_GhostJoins).
                                          super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                  ]), bVar4)))) {
      op2 = AddOutPt(this,e,Pt);
      AddJoin(this,op1,op2,e1->Top);
    }
  }
  return op1;
}

Assistant:

OutPt* Clipper::AddLocalMinPoly(TEdge *e1, TEdge *e2, const IntPoint &Pt)
{
  OutPt* result;
  TEdge *e, *prevE;
  if (IsHorizontal(*e2) || ( e1->Dx > e2->Dx ))
  {
    result = AddOutPt(e1, Pt);
    e2->OutIdx = e1->OutIdx;
    e1->Side = esLeft;
    e2->Side = esRight;
    e = e1;
    if (e->PrevInAEL == e2)
      prevE = e2->PrevInAEL; 
    else
      prevE = e->PrevInAEL;
  } else
  {
    result = AddOutPt(e2, Pt);
    e1->OutIdx = e2->OutIdx;
    e1->Side = esRight;
    e2->Side = esLeft;
    e = e2;
    if (e->PrevInAEL == e1)
        prevE = e1->PrevInAEL;
    else
        prevE = e->PrevInAEL;
  }

  if (prevE && prevE->OutIdx >= 0 && prevE->Top.Y < Pt.Y && e->Top.Y < Pt.Y) 
  {
    cInt xPrev = TopX(*prevE, Pt.Y);
    cInt xE = TopX(*e, Pt.Y);
    if (xPrev == xE && (e->WindDelta != 0) && (prevE->WindDelta != 0) &&
      SlopesEqual(IntPoint(xPrev, Pt.Y), prevE->Top, IntPoint(xE, Pt.Y), e->Top, m_UseFullRange))
    {
      OutPt* outPt = AddOutPt(prevE, Pt);
      AddJoin(result, outPt, e->Top);
    }
  }
  return result;
}